

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-records_pathway.c
# Opt level: O3

void CGTFS_RecordPathway(void)

{
  int iVar1;
  long lVar2;
  undefined **ppuVar3;
  pathway_t *ppVar4;
  byte bVar5;
  char *field_names [12];
  pathway_t pw_1;
  char *field_values [12];
  pathway_t m;
  pathway_t l;
  pathway_t k;
  pathway_t j;
  pathway_t i;
  pathway_t h;
  pathway_t g;
  pathway_t f;
  pathway_t e;
  pathway_t d;
  pathway_t pStack_1ad8;
  pathway_t local_18f0;
  pathway_t local_1708;
  pathway_t local_1518;
  pathway_t local_1330;
  pathway_t local_1148;
  pathway_t local_f60;
  pathway_t local_d78;
  pathway_t local_b90;
  pathway_t local_9a8;
  pathway_t local_7c0;
  pathway_t local_5d8;
  pathway_t local_3f0;
  pathway_t local_208;
  
  bVar5 = 0;
  iVar1 = greatest_test_pre("pathway_read");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      ppuVar3 = &PTR_anon_var_dwarf_27ca_00233f40;
      ppVar4 = &pStack_1ad8;
      for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
        *(undefined **)ppVar4 = *ppuVar3;
        ppuVar3 = ppuVar3 + (ulong)bVar5 * -2 + 1;
        ppVar4 = (pathway_t *)((long)ppVar4 + ((ulong)bVar5 * -2 + 1) * 8);
      }
      ppuVar3 = &PTR_anon_var_dwarf_284e_00233fa0;
      ppVar4 = &local_1708;
      for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
        *(undefined **)ppVar4->id = *ppuVar3;
        ppuVar3 = ppuVar3 + (ulong)bVar5 * -2 + 1;
        ppVar4 = (pathway_t *)((long)ppVar4 + ((ulong)bVar5 * -2 + 1) * 8);
      }
      read_pathway(&local_18f0,0xc,(char **)&pStack_1ad8,(char **)&local_1708);
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = greatest_do_assert_equal_t
                        ("INDEX456_abc",&local_18f0,&greatest_type_info_string,(void *)0x0);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x16;
        if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
LAB_00121d81:
          greatest_info.msg = "type_info->equal callback missing!";
        }
        else {
          greatest_info.msg = "\"INDEX456_abc\" != pw_1.id";
        }
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar1 = greatest_do_assert_equal_t
                          ("STOP_ID1",local_18f0.from_stop_id,&greatest_type_info_string,(void *)0x0
                          );
        if (iVar1 == 0) {
          greatest_info.fail_line = 0x17;
          if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_00121d81;
          greatest_info.msg = "\"STOP_ID1\" != pw_1.from_stop_id";
        }
        else {
          greatest_info.assertions = greatest_info.assertions + 1;
          iVar1 = greatest_do_assert_equal_t
                            ("STOP_ID2",local_18f0.to_stop_id,&greatest_type_info_string,(void *)0x0
                            );
          if (iVar1 == 0) {
            greatest_info.fail_line = 0x18;
            if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_00121d81;
            greatest_info.msg = "\"STOP_ID2\" != pw_1.to_stop_id";
          }
          else if (local_18f0.mode == PTMD_MOVING) {
            if (local_18f0.is_bidirectional == PD_BIDIRECTIONAL) {
              if ((local_18f0.length != 123.4) || (NAN(local_18f0.length))) {
                greatest_info.fail_line = 0x1b;
                greatest_info.msg = "123.4 != pw_1.length";
                greatest_info.assertions = greatest_info.assertions + 3;
              }
              else if (local_18f0.traversal_time == 0xe10) {
                if (local_18f0.stair_count == 0xc) {
                  if ((local_18f0.max_slope != -1.008) || (NAN(local_18f0.max_slope))) {
                    greatest_info.fail_line = 0x1e;
                    greatest_info.msg = "-1.008 != pw_1.max_slope";
                    greatest_info.assertions = greatest_info.assertions + 6;
                  }
                  else if ((local_18f0.min_width != 2.3) || (NAN(local_18f0.min_width))) {
                    greatest_info.fail_line = 0x1f;
                    greatest_info.msg = "2.3 != pw_1.min_width";
                    greatest_info.assertions = greatest_info.assertions + 7;
                  }
                  else {
                    greatest_info.assertions = greatest_info.assertions + 8;
                    iVar1 = greatest_do_assert_equal_t
                                      ("Something A",local_18f0.signposted_as,
                                       &greatest_type_info_string,(void *)0x0);
                    if (iVar1 == 0) {
                      greatest_info.fail_line = 0x20;
                      if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0)
                      goto LAB_00121d81;
                      greatest_info.msg = "\"Something A\" != pw_1.signposted_as";
                    }
                    else {
                      greatest_info.assertions = greatest_info.assertions + 1;
                      iVar1 = greatest_do_assert_equal_t
                                        ("Something B",local_18f0.reversed_signposted_as,
                                         &greatest_type_info_string,(void *)0x0);
                      if (iVar1 != 0) {
                        greatest_info.msg = (char *)0x0;
                        iVar1 = 0;
                        goto LAB_00121da3;
                      }
                      greatest_info.fail_line = 0x21;
                      if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0)
                      goto LAB_00121d81;
                      greatest_info.msg = "\"Something B\" != pw_1.reversed_signposted_as";
                    }
                  }
                }
                else {
                  greatest_info.fail_line = 0x1d;
                  greatest_info.msg = "12 != pw_1.stair_count";
                  greatest_info.assertions = greatest_info.assertions + 5;
                }
              }
              else {
                greatest_info.fail_line = 0x1c;
                greatest_info.msg = "3600 != pw_1.traversal_time";
                greatest_info.assertions = greatest_info.assertions + 4;
              }
            }
            else {
              greatest_info.fail_line = 0x1a;
              greatest_info.msg = "PD_BIDIRECTIONAL != pw_1.is_bidirectional";
              greatest_info.assertions = greatest_info.assertions + 2;
            }
          }
          else {
            greatest_info.fail_line = 0x19;
            greatest_info.msg = "PTMD_MOVING != pw_1.mode";
            greatest_info.assertions = greatest_info.assertions + 1;
          }
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_pathway.c"
      ;
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_001222a3;
    }
LAB_00121da3:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("pathway_compare");
  if (iVar1 == 0) {
    return;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
  if (iVar1 == 0) {
    memcpy(&local_18f0,"INDEX456_abc",0x1e8);
    memcpy(&pStack_1ad8,"INDEX456_abc",0x1e8);
    memcpy(&local_1708,"INDEX457_abc",0x1e8);
    memcpy(&local_208,"INDEX456_abc",0x1e8);
    memcpy(&local_3f0,"INDEX456_abc",0x1e8);
    memcpy(&local_5d8,"INDEX456_abc",0x1e8);
    memcpy(&local_7c0,"INDEX456_abc",0x1e8);
    memcpy(&local_9a8,"INDEX456_abc",0x1e8);
    memcpy(&local_b90,"INDEX456_abc",0x1e8);
    memcpy(&local_d78,"INDEX456_abc",0x1e8);
    memcpy(&local_f60,"INDEX456_abc",0x1e8);
    memcpy(&local_1148,"INDEX456_abc",0x1e8);
    memcpy(&local_1330,"INDEX456_abc",0x1e8);
    memcpy(&local_1518,"INDEX456_abc",0x1e8);
    greatest_info.assertions = greatest_info.assertions + 1;
    iVar1 = equal_pathway(&local_18f0,&pStack_1ad8);
    if (iVar1 == 1) {
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = equal_pathway(&local_18f0,&local_1708);
      if (iVar1 == 0) {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar1 = equal_pathway(&pStack_1ad8,&local_1708);
        if (iVar1 == 0) {
          greatest_info.assertions = greatest_info.assertions + 1;
          iVar1 = equal_pathway(&pStack_1ad8,&local_208);
          if (iVar1 == 0) {
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar1 = equal_pathway(&pStack_1ad8,&local_3f0);
            if (iVar1 == 0) {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar1 = equal_pathway(&pStack_1ad8,&local_5d8);
              if (iVar1 == 0) {
                greatest_info.assertions = greatest_info.assertions + 1;
                iVar1 = equal_pathway(&pStack_1ad8,&local_7c0);
                if (iVar1 == 0) {
                  greatest_info.assertions = greatest_info.assertions + 1;
                  iVar1 = equal_pathway(&pStack_1ad8,&local_9a8);
                  if (iVar1 == 0) {
                    greatest_info.assertions = greatest_info.assertions + 1;
                    iVar1 = equal_pathway(&pStack_1ad8,&local_b90);
                    if (iVar1 == 0) {
                      greatest_info.assertions = greatest_info.assertions + 1;
                      iVar1 = equal_pathway(&pStack_1ad8,&local_d78);
                      if (iVar1 == 0) {
                        greatest_info.assertions = greatest_info.assertions + 1;
                        iVar1 = equal_pathway(&pStack_1ad8,&local_f60);
                        if (iVar1 == 0) {
                          greatest_info.assertions = greatest_info.assertions + 1;
                          iVar1 = equal_pathway(&pStack_1ad8,&local_1148);
                          if (iVar1 == 0) {
                            greatest_info.assertions = greatest_info.assertions + 1;
                            iVar1 = equal_pathway(&pStack_1ad8,&local_1330);
                            if (iVar1 == 0) {
                              greatest_info.assertions = greatest_info.assertions + 1;
                              iVar1 = equal_pathway(&pStack_1ad8,&local_1518);
                              if (iVar1 == 0) {
                                greatest_info.msg = (char *)0x0;
                                iVar1 = 0;
                                goto LAB_00121faa;
                              }
                              greatest_info.fail_line = 0x106;
                              greatest_info.msg = "0 != equal_pathway(&b, &n)";
                            }
                            else {
                              greatest_info.fail_line = 0x105;
                              greatest_info.msg = "0 != equal_pathway(&b, &m)";
                            }
                          }
                          else {
                            greatest_info.fail_line = 0x104;
                            greatest_info.msg = "0 != equal_pathway(&b, &l)";
                          }
                        }
                        else {
                          greatest_info.fail_line = 0x103;
                          greatest_info.msg = "0 != equal_pathway(&b, &k)";
                        }
                      }
                      else {
                        greatest_info.fail_line = 0x102;
                        greatest_info.msg = "0 != equal_pathway(&b, &j)";
                      }
                    }
                    else {
                      greatest_info.fail_line = 0x101;
                      greatest_info.msg = "0 != equal_pathway(&b, &i)";
                    }
                  }
                  else {
                    greatest_info.fail_line = 0x100;
                    greatest_info.msg = "0 != equal_pathway(&b, &h)";
                  }
                }
                else {
                  greatest_info.fail_line = 0xff;
                  greatest_info.msg = "0 != equal_pathway(&b, &g)";
                }
              }
              else {
                greatest_info.fail_line = 0xfe;
                greatest_info.msg = "0 != equal_pathway(&b, &f)";
              }
            }
            else {
              greatest_info.fail_line = 0xfd;
              greatest_info.msg = "0 != equal_pathway(&b, &e)";
            }
          }
          else {
            greatest_info.fail_line = 0xfc;
            greatest_info.msg = "0 != equal_pathway(&b, &d)";
          }
        }
        else {
          greatest_info.fail_line = 0xfb;
          greatest_info.msg = "0 != equal_pathway(&b, &c)";
        }
      }
      else {
        greatest_info.fail_line = 0xfa;
        greatest_info.msg = "0 != equal_pathway(&a, &c)";
      }
    }
    else {
      greatest_info.fail_line = 0xf9;
      greatest_info.msg = "1 != equal_pathway(&a, &b)";
    }
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_pathway.c"
    ;
    iVar1 = -1;
    if ((greatest_info.flags & 4) != 0) {
LAB_001222a3:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_pathway.c"
      ;
      abort();
    }
  }
LAB_00121faa:
  greatest_test_post(iVar1);
  return;
}

Assistant:

SUITE(CGTFS_RecordPathway) {
    RUN_TEST(pathway_read);
    RUN_TEST(pathway_compare);
}